

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  ValidationState_t *pVVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  spv_result_t id;
  AddressingModel AVar11;
  StorageClass SVar12;
  uint uVar13;
  uint32_t uVar14;
  uint uVar15;
  TensorAddressingOperandsMask TVar16;
  int32_t iVar17;
  spv_result_t sVar18;
  spv_result_t sVar19;
  long *plVar20;
  undefined8 *puVar21;
  Instruction *pIVar22;
  Instruction *pIVar23;
  _Any_data *__return_storage_ptr__;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  _Any_data *p_Var24;
  Instruction *pIVar25;
  DiagnosticStream *pDVar26;
  byte bVar27;
  _func_void *p_Var28;
  ulong uVar29;
  byte bVar30;
  uint32_t id_00;
  long lVar31;
  ulong uVar32;
  int iVar33;
  byte bVar34;
  char **ppcVar35;
  spv_const_context psVar36;
  size_t sVar37;
  char *pcVar38;
  byte bVar39;
  Op opcode;
  undefined8 uVar40;
  byte bVar41;
  byte bVar42;
  spv_result_t unaff_R15D;
  uint64_t *val;
  string instr_name;
  uint64_t array_length;
  uint32_t data_type;
  uint64_t dim_value;
  string errorVUID;
  _Any_data local_2a8;
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  Instruction *local_258;
  byte local_24a;
  char local_249;
  undefined1 local_248 [16];
  undefined1 local_238 [24];
  Function *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  spv_result_t local_48;
  undefined8 local_40;
  _Base_ptr local_38;
  
  uVar3 = (inst->inst_).opcode;
  opcode = (Op)uVar3;
  if (0x1141 < uVar3) {
    if (0x14ee < uVar3) {
      if (0x14f6 < uVar3) {
        if (uVar3 - 0x14f7 < 2) {
          if (opcode == OpCooperativeMatrixLoadTensorNV) {
            local_248._0_8_ = "spv::Op::OpCooperativeMatrixLoadTensorNV";
            pIVar22 = inst;
          }
          else {
            uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,1);
            pIVar22 = ValidationState_t::FindDef(_,uVar13);
            local_248._0_8_ = "spv::Op::OpCooperativeMatrixStoreTensorNV";
          }
          uVar14 = (pIVar22->inst_).type_id;
          pIVar22 = ValidationState_t::FindDef(_,uVar14);
          uVar4 = (inst->inst_).opcode;
          if ((pIVar22->inst_).opcode != 0x1168) {
            if (uVar4 == 0x14f7) {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              pcVar38 = "spv::Op::OpCooperativeMatrixLoadTensorNV Result Type <id> ";
              lVar31 = 0x3a;
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              pcVar38 = "spv::Op::OpCooperativeMatrixStoreTensorNV Object type <id> ";
              lVar31 = 0x3b;
            }
            goto LAB_00193831;
          }
          id = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar4 == 0x14f7) * 2));
          pIVar23 = ValidationState_t::FindDef(_,id);
          if ((pIVar23 == (Instruction *)0x0) ||
             ((AVar11 = ValidationState_t::addressing_model(_), AVar11 == AddressingModelLogical &&
              ((((_->features_).variable_pointers == false &&
                (iVar17 = spvOpcodeReturnsLogicalPointer((uint)(pIVar23->inst_).opcode), iVar17 == 0
                )) || (((_->features_).variable_pointers == true &&
                       (bVar7 = spvOpcodeReturnsLogicalVariablePointer
                                          ((uint)(pIVar23->inst_).opcode), !bVar7)))))))) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            pDVar26 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26," Pointer <id> ",0xe);
            goto LAB_00193c53;
          }
          id_00 = (pIVar23->inst_).type_id;
          pIVar23 = ValidationState_t::FindDef(_,id_00);
          if ((pIVar23 == (Instruction *)0x0) || ((pIVar23->inst_).opcode != 0x20)) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            pDVar26 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26," type for pointer <id> ",0x17);
            goto LAB_00193ac9;
          }
          SVar12 = Instruction::GetOperandAs<spv::StorageClass>(pIVar23,1);
          if (((SVar12 != StorageClassWorkgroup) && (SVar12 != StorageBuffer)) &&
             (SVar12 != PhysicalStorageBuffer)) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a8,_,0x230d,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                       local_2a8._8_8_);
            pDVar26 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26," storage class for pointer type <id> ",0x25);
LAB_001955b8:
            ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,id_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26,(char *)local_278._0_8_,local_278._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26,
                       " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.",0x3b);
            local_48 = pDVar26->error_;
            if ((ValidationState_t *)local_278._0_8_ != (ValidationState_t *)(local_278 + 0x10)) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
            }
            goto LAB_00193f6c;
          }
          if ((inst->inst_).opcode == 0x14f7) {
            id = Instruction::GetOperandAs<unsigned_int>(inst,3);
            pIVar23 = ValidationState_t::FindDef(_,id);
            if ((pIVar23 == (Instruction *)0x0) || ((pIVar23->inst_).type_id != uVar14)) {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              pDVar26 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)local_248);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26," Object <id> ",0xd);
              ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26," type does not match Result Type.",0x21);
              id = pDVar26->error_;
              if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298)
              {
                operator_delete(local_2a8._M_unused._M_object,
                                (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
              bVar7 = false;
            }
            else {
              bVar7 = true;
            }
            sVar18 = id;
            if (!bVar7) goto joined_r0x00193f8e;
          }
          uVar13 = Instruction::GetOperandAs<unsigned_int>
                             (inst,(ulong)((inst->inst_).opcode == 0x14f7) * 2 + 2);
          pIVar23 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar23 == (Instruction *)0x0) ||
             (pIVar25 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id),
             (pIVar25->inst_).opcode != 0x14fa)) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            pDVar26 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26," TensorLayout <id> ",0x13);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
            pcVar38 = " does not have a tensor layout type.";
            lVar31 = 0x24;
            goto LAB_00193c75;
          }
          uVar13 = (uint)((inst->inst_).opcode == 0x14f7) * 2 + 3;
          local_258 = pIVar23;
          if (((ulong)uVar13 <
               (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4)) &&
             (sVar18 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar13), sVar18 != SPV_SUCCESS))
          goto joined_r0x00193f8e;
          uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar13);
          iVar33 = ((uVar15 >> 3 & 1) + uVar13 + (uint)((uVar15 >> 4 & 1) != 0)) -
                   (uint)((uVar15 & 2) == 0);
          TVar16 = Instruction::GetOperandAs<spv::TensorAddressingOperandsMask>
                             (inst,(ulong)(iVar33 + 2U));
          if ((ulong)((TVar16 & TensorView) + TensorView + iVar33 + 2U +
                     (uint)((TVar16 >> 1 & 1) != 0)) <=
              (ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            uVar13 = iVar33 + 3;
            if ((TVar16 & TensorView) != MaskNone) {
              local_298._20_4_ = uVar13;
              uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar13);
              local_220 = (Function *)CONCAT44(local_220._4_4_,uVar13);
              pIVar23 = ValidationState_t::FindDef(_,uVar13);
              if ((pIVar23 == (Instruction *)0x0) ||
                 (pIVar23 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id),
                 (pIVar23->inst_).opcode != 0x14fb)) {
                ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
                pDVar26 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)&local_218,(char **)local_248);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar26," TensorView <id> ",0x11);
                ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,(uint32_t)local_220);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar26," does not have a tensor view type.",0x22);
                id = pDVar26->error_;
                if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298
                   ) {
                  operator_delete(local_2a8._M_unused._M_object,
                                  (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
                }
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
                bVar7 = false;
                uVar13 = local_298._20_4_;
              }
              else {
                bVar7 = true;
                uVar13 = iVar33 + 4;
              }
              sVar18 = id;
              if (!bVar7) goto joined_r0x00193f8e;
            }
            if ((TVar16 & DecodeFunc) == MaskNone) goto LAB_0019430f;
            if ((inst->inst_).opcode == 0x14f8) {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              pcVar38 = "OpCooperativeMatrixStoreTensorNV does not support DecodeFunc.";
              lVar31 = 0x3d;
              goto LAB_00193bb9;
            }
            local_298._20_4_ = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar13);
            pIVar23 = ValidationState_t::FindDef(_,local_298._20_4_);
            if ((pIVar23 == (Instruction *)0x0) || ((pIVar23->inst_).opcode != 0x36)) {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              pDVar26 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)local_248);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26," DecodeFunc <id> ",0x11);
              ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,local_298._20_4_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
              pcVar38 = " is not a function.";
              lVar31 = 0x13;
            }
            else {
              uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,1);
              uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,3);
              pIVar22 = ValidationState_t::FindDef(_,uVar15);
              uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,1);
              if (uVar15 == uVar13) {
                uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
                pIVar23 = ValidationState_t::FindDef(_,uVar13);
                SVar12 = Instruction::GetOperandAs<spv::StorageClass>(pIVar23,1);
                if (SVar12 == PhysicalStorageBuffer) {
                  local_258 = ValidationState_t::FindDef(_,(local_258->inst_).type_id);
                  sVar37 = 3;
                  do {
                    uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,sVar37);
                    pIVar23 = ValidationState_t::FindDef(_,uVar13);
                    if ((pIVar23->inst_).opcode == 0x1c) {
                      uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
                      bVar8 = ValidationState_t::EvalConstantValUint64
                                        (_,uVar13,(uint64_t *)local_278);
                      bVar7 = true;
                      if (bVar8) {
                        uVar13 = Instruction::GetOperandAs<unsigned_int>(local_258,1);
                        bVar8 = ValidationState_t::EvalConstantValUint64
                                          (_,uVar13,(uint64_t *)(local_238 + 0x10));
                        bVar7 = true;
                        if ((bVar8) && (local_278._0_8_ != local_238._16_8_)) goto LAB_001964db;
                      }
                    }
                    else {
LAB_001964db:
                      ValidationState_t::diag
                                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
                      pDVar26 = DiagnosticStream::operator<<
                                          ((DiagnosticStream *)&local_218,(char **)local_248);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar26," DecodeFunc <id> ",0x11);
                      ValidationState_t::getIdName_abi_cxx11_
                                ((string *)&local_2a8,_,local_298._20_4_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,
                                 local_2a8._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar26,
                                 " second/third parameter must be array of 32-bit integer with ",
                                 0x3d);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar26," dimension equal to the tensor dimension.",0x29
                                );
                      id = pDVar26->error_;
                      if ((ValidationState_t *)local_2a8._M_unused._0_8_ !=
                          (ValidationState_t *)local_298) {
                        operator_delete(local_2a8._M_unused._M_object,
                                        (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
                      }
                      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
                      bVar7 = false;
                    }
                  } while ((bVar7) && (bVar8 = sVar37 != 4, sVar37 = sVar37 + 1, bVar8));
                  goto joined_r0x0019664d;
                }
                ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
                pDVar26 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)&local_218,(char **)local_248);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar26," DecodeFunc <id> ",0x11);
                ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,local_298._20_4_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
                pcVar38 = " first parameter must be pointer to PhysicalStorageBuffer.";
                lVar31 = 0x3a;
              }
              else {
                ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
                pDVar26 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)&local_218,(char **)local_248);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar26," DecodeFunc <id> ",0x11);
                ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,local_298._20_4_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
                pcVar38 = " return type must match matrix component type.";
                lVar31 = 0x2e;
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar26,pcVar38,lVar31);
            id = pDVar26->error_;
            if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
              operator_delete(local_2a8._M_unused._M_object,
                              (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            bVar7 = false;
            goto joined_r0x0019664d;
          }
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          pDVar26 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)local_248);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar26," not enough tensor addressing operands.",0x27);
          local_48 = pDVar26->error_;
          goto LAB_00193f86;
        }
        if (uVar3 != 0x1516) goto switchD_001925f4_caseD_1145;
        local_248._0_8_ = inst;
        pcVar38 = spvOpcodeString(OpRawAccessChainNV);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_218._M_pod_data,pcVar38,(allocator<char> *)local_278);
        puVar21 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x3700a0);
        local_2a8._M_unused._M_object = local_298;
        p_Var28 = (_func_void *)(puVar21 + 2);
        if ((_func_void *)*puVar21 == p_Var28) {
          local_298._0_8_ = *(undefined8 *)p_Var28;
          local_298._8_8_ = puVar21[3];
        }
        else {
          local_298._0_8_ = *(undefined8 *)p_Var28;
          local_2a8._M_unused._M_object = (_func_void *)*puVar21;
        }
        local_2a8._8_8_ = puVar21[1];
        *puVar21 = p_Var28;
        puVar21[1] = 0;
        *(undefined1 *)(puVar21 + 2) = 0;
        if ((code **)local_218._M_unused._0_8_ != &local_208) {
          operator_delete(local_218._M_unused._M_object,(ulong)(local_208 + 1));
        }
        pIVar22 = ValidationState_t::FindDef(_,*(uint32_t *)(local_248._0_8_ + 0x40));
        if ((pIVar22->inst_).opcode == 0x20) {
          SVar12 = Instruction::GetOperandAs<spv::StorageClass>(pIVar22,1);
          if (((SVar12 == StorageClassUniform) || (SVar12 == StorageBuffer)) ||
             (SVar12 == PhysicalStorageBuffer)) {
            uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
            pIVar22 = ValidationState_t::FindDef(_,uVar13);
            uVar13 = (uint)(pIVar22->inst_).opcode;
            if ((0x1e < uVar13) || ((0x51000000U >> (uVar13 & 0x1f) & 1) == 0)) {
              uVar13 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_248._0_8_,3);
              pIVar22 = ValidationState_t::FindDef(_,uVar13);
              if ((pIVar22->inst_).opcode != 0x2b) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_248._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,"The Stride of ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                           local_2a8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data," <id> ",6);
                ValidationState_t::getIdName_abi_cxx11_
                          ((string *)local_278,_,*(uint32_t *)(local_248._0_8_ + 0x44));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_)
                ;
                pcVar38 = " must be OpConstant. Found Op";
                lVar31 = 0x1d;
                goto LAB_001937d7;
              }
              pIVar23 = ValidationState_t::FindDef(_,(pIVar22->inst_).type_id);
              if ((pIVar23->inst_).opcode != 0x15) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_248._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,"The type of Stride of ",0x16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                           local_2a8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data," <id> ",6);
                ValidationState_t::getIdName_abi_cxx11_
                          ((string *)local_278,_,*(uint32_t *)(local_248._0_8_ + 0x44));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data," must be OpTypeInt. Found Op",0x1c);
                local_238._16_8_ = spvOpcodeString((uint)(pIVar23->inst_).opcode);
                goto LAB_001937f7;
              }
              local_278._8_8_ = local_248;
              local_278._0_8_ = _;
              local_278._16_8_ = &local_2a8;
              sVar18 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                                 ((anon_class_24_3_e757d3e0 *)local_278,"Index",4);
              if ((sVar18 != SPV_SUCCESS) ||
                 (sVar18 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::
                           operator()((anon_class_24_3_e757d3e0 *)local_278,"Offset",5),
                 sVar18 != SPV_SUCCESS)) goto LAB_0019406a;
              uVar13 = 0;
              if (0x60 < (ulong)((long)*(pointer *)(local_248._0_8_ + 0x20) -
                                (long)(((vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                         *)(local_248._0_8_ + 0x18))->
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      )._M_impl.super__Vector_impl_data._M_start)) {
                uVar13 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_248._0_8_,6);
              }
              if ((uVar13 & 2) != 0) {
                val = (uint64_t *)(local_238 + 0x10);
                local_238._16_8_ = (ValidationState_t *)0x0;
                bVar7 = ValidationState_t::EvalConstantValUint64(_,(pIVar22->inst_).result_id,val);
                bVar8 = (ValidationState_t *)local_238._16_8_ == (ValidationState_t *)0x0;
                if (bVar8 && bVar7) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)local_248._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,
                             "Stride must not be zero when per-element robustness is used.",0x3c);
                  val = (uint64_t *)(ulong)(uint)local_48;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
                }
                sVar18 = (spv_result_t)val;
                if (bVar8 && bVar7) goto LAB_0019406a;
              }
              if ((uVar13 & 1) == 0) {
                if ((SVar12 == PhysicalStorageBuffer) && ((uVar13 & 2) != 0)) goto LAB_0019616e;
LAB_00196664:
                sVar18 = SPV_SUCCESS;
                if ((~uVar13 & 3) != 0) goto LAB_0019406a;
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_248._0_8_);
                pcVar38 = 
                "Per-component robustness and per-element robustness are mutually exclusive.";
                lVar31 = 0x4b;
              }
              else {
                if (SVar12 != PhysicalStorageBuffer) goto LAB_00196664;
LAB_0019616e:
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_248._0_8_);
                pcVar38 = 
                "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
                ;
                lVar31 = 0x57;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
              sVar18 = local_48;
              goto LAB_00194065;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                       (Instruction *)local_248._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                       local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)local_278,_,*(uint32_t *)(local_248._0_8_ + 0x44));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
            pcVar38 = " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
            lVar31 = 0x3e;
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                       (Instruction *)local_248._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                       local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)local_278,_,*(uint32_t *)(local_248._0_8_ + 0x44));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
            pcVar38 = 
            " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform.";
            lVar31 = 0x53;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
          sVar18 = local_48;
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                     (Instruction *)local_248._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                     local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_
                    ((string *)local_278,_,*(uint32_t *)(local_248._0_8_ + 0x44));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
          pcVar38 = " must be OpTypePointer. Found Op";
          lVar31 = 0x20;
LAB_001937d7:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
          local_238._16_8_ = spvOpcodeString((uint)(pIVar22->inst_).opcode);
LAB_001937f7:
          pDVar26 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)&local_218,(char **)(local_238 + 0x10));
          local_298[0x1f] = 0x2e;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar26,local_298 + 0x1f,1);
          sVar18 = pDVar26->error_;
        }
LAB_00194046:
        if ((ValidationState_t *)local_278._0_8_ != (ValidationState_t *)(local_278 + 0x10)) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
        }
LAB_00194065:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        goto LAB_0019406a;
      }
      if (uVar3 - 0x14ef < 2) {
        if (opcode == OpCooperativeMatrixLoadNV) {
          local_278._0_8_ = "spv::Op::OpCooperativeMatrixLoadNV";
          pIVar22 = inst;
        }
        else {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,1);
          pIVar22 = ValidationState_t::FindDef(_,uVar13);
          local_278._0_8_ = "spv::Op::OpCooperativeMatrixStoreNV";
        }
        uVar14 = (pIVar22->inst_).type_id;
        pIVar22 = ValidationState_t::FindDef(_,uVar14);
        uVar4 = (inst->inst_).opcode;
        if ((pIVar22->inst_).opcode != 0x14ee) {
          if (uVar4 == 0x14ef) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar38 = "spv::Op::OpCooperativeMatrixLoadNV Result Type <id> ";
            lVar31 = 0x34;
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar38 = "spv::Op::OpCooperativeMatrixStoreNV Object type <id> ";
LAB_0019342f:
            lVar31 = 0x35;
          }
LAB_00193831:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                     local_2a8._8_8_);
          pcVar38 = " is not a cooperative matrix type.";
          lVar31 = 0x22;
          goto LAB_00193f55;
        }
        id = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar4 == 0x14ef) * 2));
        pIVar22 = ValidationState_t::FindDef(_,id);
        if ((pIVar22 == (Instruction *)0x0) ||
           ((AVar11 = ValidationState_t::addressing_model(_), AVar11 == AddressingModelLogical &&
            ((((_->features_).variable_pointers == false &&
              (iVar17 = spvOpcodeReturnsLogicalPointer((uint)(pIVar22->inst_).opcode), iVar17 == 0))
             || (((_->features_).variable_pointers == true &&
                 (bVar7 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar22->inst_).opcode),
                 !bVar7)))))))) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          ppcVar35 = (char **)local_278;
LAB_00193c29:
          pDVar26 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,ppcVar35);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar26," Pointer <id> ",0xe);
LAB_00193c53:
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
          pcVar38 = " is not a logical pointer.";
          lVar31 = 0x1a;
        }
        else {
          uVar14 = (pIVar22->inst_).type_id;
          pIVar23 = ValidationState_t::FindDef(_,uVar14);
          if ((pIVar23 != (Instruction *)0x0) && ((pIVar23->inst_).opcode == 0x20)) {
            SVar12 = Instruction::GetOperandAs<spv::StorageClass>(pIVar23,1);
            if ((SVar12 != StorageClassWorkgroup) &&
               ((SVar12 != StorageBuffer && (SVar12 != PhysicalStorageBuffer)))) {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              pDVar26 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)local_278);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26," storage class for pointer type <id> ",0x25);
              ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26," is not Workgroup or StorageBuffer.",0x23);
              local_48 = pDVar26->error_;
              goto LAB_00193f6c;
            }
            uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
            pIVar23 = ValidationState_t::FindDef(_,uVar13);
            if ((pIVar23 == (Instruction *)0x0) ||
               ((bVar7 = ValidationState_t::IsIntScalarOrVectorType(_,uVar13), !bVar7 &&
                (bVar7 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar13), !bVar7)))) {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              pDVar26 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)local_278);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26," Pointer <id> ",0xe);
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)&local_2a8,_,(pIVar22->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
              pcVar38 = "s Type must be a scalar or vector type.";
              lVar31 = 0x27;
              goto LAB_00193c75;
            }
            uVar13 = Instruction::GetOperandAs<unsigned_int>
                               (inst,(ulong)((inst->inst_).opcode == 0x14ef) | 2);
            pIVar22 = ValidationState_t::FindDef(_,uVar13);
            if ((pIVar22 == (Instruction *)0x0) ||
               (bVar7 = ValidationState_t::IsIntScalarType(_,(pIVar22->inst_).type_id), !bVar7)) {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,"Stride operand <id> ",0x14);
              ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                         local_2a8._8_8_);
              pcVar38 = " must be a scalar integer type.";
              lVar31 = 0x1f;
            }
            else {
              uVar13 = Instruction::GetOperandAs<unsigned_int>
                                 (inst,(ulong)((inst->inst_).opcode == 0x14ef) + 3);
              pIVar22 = ValidationState_t::FindDef(_,uVar13);
              if (((pIVar22 != (Instruction *)0x0) &&
                  (bVar7 = ValidationState_t::IsBoolScalarType(_,(pIVar22->inst_).type_id), bVar7))
                 && ((iVar17 = spvOpcodeIsConstant((uint)(pIVar22->inst_).opcode), iVar17 != 0 ||
                     (iVar17 = spvOpcodeIsSpecConstant((uint)(pIVar22->inst_).opcode), iVar17 != 0))
                    )) {
                uVar13 = (inst->inst_).opcode == 0x14ef | 4;
                if ((ulong)((long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)uVar13)
                goto LAB_0019430f;
                sVar18 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar13);
                goto joined_r0x00192be4;
              }
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,"Column Major operand <id> ",0x1a);
              ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                         local_2a8._8_8_);
              pcVar38 = " must be a boolean constant instruction.";
              lVar31 = 0x28;
            }
LAB_00193f55:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
            goto LAB_00193f6c;
          }
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          ppcVar35 = (char **)local_278;
LAB_00193a9f:
          pDVar26 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,ppcVar35);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar26," type for pointer <id> ",0x17);
LAB_00193ac9:
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
          pcVar38 = " is not a pointer type.";
          lVar31 = 0x17;
        }
LAB_00193c75:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar26,pcVar38,lVar31);
        local_48 = pDVar26->error_;
        goto LAB_00193f6c;
      }
      if (opcode != OpCooperativeMatrixLengthNV) goto switchD_001925f4_caseD_1145;
LAB_00192e59:
      pcVar38 = spvOpcodeString(opcode);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_218._M_pod_data,pcVar38,(allocator<char> *)local_278);
      puVar21 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x3700a0);
      plVar20 = puVar21 + 2;
      if ((long *)*puVar21 == plVar20) {
        local_298._0_8_ = *plVar20;
        local_298._8_8_ = puVar21[3];
        local_2a8._M_unused._M_object = local_298;
      }
      else {
        local_298._0_8_ = *plVar20;
        local_2a8._M_unused._M_object = (long *)*puVar21;
      }
      local_2a8._8_8_ = puVar21[1];
      *puVar21 = plVar20;
      puVar21[1] = 0;
      *(undefined1 *)(puVar21 + 2) = 0;
      if ((code **)local_218._M_unused._0_8_ != &local_208) {
        operator_delete(local_218._M_unused._M_object,(ulong)(local_208 + 1));
      }
      pIVar22 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
      if ((((pIVar22->inst_).opcode == 0x15) &&
          (uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,1), uVar13 == 0x20)) &&
         (uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2), uVar13 == 0)) {
        uVar4 = (inst->inst_).opcode;
        uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar22 = ValidationState_t::FindDef(_,uVar13);
        uVar5 = (pIVar22->inst_).opcode;
        if (uVar4 == 0x116c) {
          if (uVar5 != 0x1168) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The type in ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                       local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
            pcVar38 = " must be OpTypeCooperativeMatrixKHR.";
            lVar31 = 0x24;
            goto LAB_001932c3;
          }
        }
        else if (uVar5 != 0x14ee) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"The type in ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                     local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
          pcVar38 = " must be OpTypeCooperativeMatrixNV.";
          lVar31 = 0x23;
          goto LAB_001932c3;
        }
        sVar18 = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                   local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,(inst->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
        pcVar38 = " must be OpTypeInt with width 32 and signedness 0.";
        lVar31 = 0x32;
LAB_001932c3:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
        if ((ValidationState_t *)local_278._0_8_ != (ValidationState_t *)(local_278 + 0x10)) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        sVar18 = local_48;
      }
      if ((undefined1 *)local_2a8._M_unused._0_8_ == local_298) goto joined_r0x00193f8e;
LAB_00194077:
      operator_delete(local_2a8._M_unused._M_object,
                      (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
      goto joined_r0x00193f8e;
    }
    switch(uVar3) {
    case 0x1142:
      goto switchD_001925f4_caseD_1142;
    case 0x1143:
    case 0x1144:
      goto switchD_001925f4_caseD_1143;
    case 0x1145:
    case 0x1146:
      break;
    case 0x1147:
    case 0x1148:
      goto switchD_001925f4_caseD_1147;
    case 0x1149:
      goto switchD_001925f4_caseD_1149;
    default:
      if (uVar3 - 0x1169 < 2) {
        if (opcode == OpCooperativeMatrixLoadKHR) {
          local_248._0_8_ = "spv::Op::OpCooperativeMatrixLoadKHR";
          pIVar22 = inst;
        }
        else {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,1);
          pIVar22 = ValidationState_t::FindDef(_,uVar13);
          local_248._0_8_ = "spv::Op::OpCooperativeMatrixStoreKHR";
        }
        uVar14 = (pIVar22->inst_).type_id;
        pIVar22 = ValidationState_t::FindDef(_,uVar14);
        uVar4 = (inst->inst_).opcode;
        if ((pIVar22->inst_).opcode != 0x1168) {
          if (uVar4 == 0x1169) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar38 = "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ";
            goto LAB_0019342f;
          }
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar38 = "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ";
          lVar31 = 0x36;
          goto LAB_00193831;
        }
        id = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar4 == 0x1169) * 2));
        pIVar22 = ValidationState_t::FindDef(_,id);
        if ((pIVar22 == (Instruction *)0x0) ||
           ((AVar11 = ValidationState_t::addressing_model(_), AVar11 == AddressingModelLogical &&
            ((((_->features_).variable_pointers == false &&
              (iVar17 = spvOpcodeReturnsLogicalPointer((uint)(pIVar22->inst_).opcode), iVar17 == 0))
             || (((_->features_).variable_pointers == true &&
                 (bVar7 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar22->inst_).opcode),
                 !bVar7)))))))) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          ppcVar35 = (char **)local_248;
          goto LAB_00193c29;
        }
        uVar14 = (pIVar22->inst_).type_id;
        local_258 = (Instruction *)CONCAT44(local_258._4_4_,uVar14);
        pIVar23 = ValidationState_t::FindDef(_,uVar14);
        if (pIVar23 == (Instruction *)0x0) {
LAB_00193a7f:
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          ppcVar35 = (char **)local_248;
          goto LAB_00193a9f;
        }
        uVar3 = (pIVar23->inst_).opcode;
        sVar18 = (spv_result_t)uVar3;
        if ((uVar3 != 0x20) && (uVar3 != 0x1141)) goto LAB_00193a7f;
        SVar12 = Instruction::GetOperandAs<spv::StorageClass>(pIVar23,1);
        bVar7 = spvIsVulkanEnv(_->context_->target_env);
        if ((bVar7) &&
           (((SVar12 != StorageClassWorkgroup && (SVar12 != StorageBuffer)) &&
            (SVar12 != PhysicalStorageBuffer)))) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a8,_,0x230d,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                     local_2a8._8_8_);
          pDVar26 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)local_248);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar26," storage class for pointer type <id> ",0x25);
          id_00 = (uint32_t)local_258;
          goto LAB_001955b8;
        }
        if (uVar3 != 0x1141) {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
          pIVar23 = ValidationState_t::FindDef(_,uVar13);
          if (pIVar23 == (Instruction *)0x0) {
LAB_00195278:
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            pDVar26 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26," Pointer <id> ",0xe);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&local_2a8,_,(pIVar22->inst_).result_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar26,"s Type must be a scalar or vector type.",0x27);
            sVar18 = pDVar26->error_;
            if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
              operator_delete(local_2a8._M_unused._M_object,
                              (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            bVar7 = false;
          }
          else {
            bVar8 = ValidationState_t::IsIntScalarOrVectorType(_,uVar13);
            bVar7 = true;
            if ((!bVar8) && (bVar8 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar13), !bVar8)
               ) goto LAB_00195278;
          }
          if (!bVar7) goto joined_r0x00193f8e;
        }
        uVar13 = Instruction::GetOperandAs<unsigned_int>
                           (inst,(ulong)((inst->inst_).opcode == 0x1169) | 2);
        pIVar22 = ValidationState_t::FindDef(_,uVar13);
        if (((pIVar22 == (Instruction *)0x0) ||
            (bVar7 = ValidationState_t::IsIntScalarType(_,(pIVar22->inst_).type_id), !bVar7)) ||
           (iVar17 = spvOpcodeIsConstant((uint)(pIVar22->inst_).opcode), iVar17 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"MemoryLayout operand <id> ",0x1a);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                     local_2a8._8_8_);
          pcVar38 = " must be a 32-bit integer constant instruction.";
          lVar31 = 0x2f;
          goto LAB_00193f55;
        }
        bVar7 = ValidationState_t::EvalConstantValUint64(_,uVar13,(uint64_t *)local_278);
        sVar37 = (ulong)((inst->inst_).opcode == 0x1169) + 3;
        if (sVar37 < (ulong)((long)(inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,sVar37);
          pIVar22 = ValidationState_t::FindDef(_,uVar13);
          if (pIVar22 == (Instruction *)0x0) {
LAB_001953e4:
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"Stride operand <id> ",0x14);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                       local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," must be a scalar integer type.",0x1f);
            if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
              operator_delete(local_2a8._M_unused._M_object,
                              (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            bVar7 = false;
            sVar18 = local_48;
          }
          else {
            bVar8 = ValidationState_t::IsIntScalarType(_,(pIVar22->inst_).type_id);
            bVar7 = true;
            if (!bVar8) goto LAB_001953e4;
          }
          if (!bVar7) goto joined_r0x00193f8e;
        }
        else if (bVar7 && (ulong)local_278._0_8_ < (ValidationState_t *)0x2) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"MemoryLayout ",0xd);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_218);
          pcVar38 = " requires a Stride.";
          lVar31 = 0x13;
          goto LAB_00193bb9;
        }
        uVar13 = (inst->inst_).opcode == 0x1169 | 4;
        if ((ulong)uVar13 <
            (ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          sVar18 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar13);
joined_r0x00192be4:
          if (sVar18 != SPV_SUCCESS) goto joined_r0x00193f8e;
        }
        goto LAB_0019430f;
      }
      if (opcode == OpCooperativeMatrixLengthKHR) goto LAB_00192e59;
    }
    goto switchD_001925f4_caseD_1145;
  }
  switch(uVar3) {
  case 0x3b:
switchD_001925f4_caseD_1142:
    sVar18 = anon_unknown_2::ValidateVariable(_,inst);
    break;
  case 0x3c:
  case 0x45:
    goto switchD_001925f4_caseD_1145;
  case 0x3d:
    pIVar22 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if (pIVar22 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpLoad Result Type <id> ",0x18);
      uVar14 = (inst->inst_).type_id;
LAB_0019391a:
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " is not defined.";
      lVar31 = 0x10;
      goto LAB_00193f55;
    }
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar23 = ValidationState_t::FindDef(_,uVar13);
    if ((pIVar23 == (Instruction *)0x0) ||
       ((AVar11 = ValidationState_t::addressing_model(_), AVar11 == AddressingModelLogical &&
        ((((_->features_).variable_pointers == false &&
          (iVar17 = spvOpcodeReturnsLogicalPointer((uint)(pIVar23->inst_).opcode), iVar17 == 0)) ||
         (((_->features_).variable_pointers == true &&
          (bVar7 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar23->inst_).opcode), !bVar7))))
        )))) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar38 = "OpLoad Pointer <id> ";
      lVar31 = 0x14;
      goto LAB_00193f22;
    }
    pIVar25 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
    if (pIVar25 != (Instruction *)0x0) {
      uVar4 = (pIVar25->inst_).opcode;
      if (uVar4 == 0x20) {
        uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
        pIVar25 = ValidationState_t::FindDef(_,uVar15);
        if ((pIVar25 == (Instruction *)0x0) ||
           ((pIVar22->inst_).result_id != (pIVar25->inst_).result_id)) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"OpLoad Result Type <id> ",0x18);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,(inst->inst_).type_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                     local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," does not match Pointer <id> ",0x1d);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,(pIVar23->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"s type.",7);
          pIVar23 = (Instruction *)(ulong)(uint)local_48;
          if ((ValidationState_t *)local_278._0_8_ != (ValidationState_t *)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
          }
          if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
            operator_delete(local_2a8._M_unused._M_object,
                            (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
          bVar7 = false;
        }
        else {
          bVar7 = true;
        }
        sVar18 = (spv_result_t)pIVar23;
        if (!bVar7) break;
      }
      else if (uVar4 != 0x1141) goto LAB_00192f34;
      if ((_->options_->before_hlsl_legalization == false) &&
         (bVar7 = ValidationState_t::ContainsRuntimeArray(_,(inst->inst_).type_id), bVar7)) {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar38 = "Cannot load a runtime-sized array";
        lVar31 = 0x21;
        goto LAB_00193bb9;
      }
      sVar18 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
      if (sVar18 == SPV_SUCCESS) {
        bVar7 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if ((((bVar7) &&
             (bVar7 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id),
             bVar7)) && (uVar3 = (pIVar22->inst_).opcode, 3 < uVar3 - 0x15)) && (uVar3 != 0x20)) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar38 = "8- or 16-bit loads must be a scalar, vector or matrix type";
          lVar31 = 0x3a;
          goto LAB_00193bb9;
        }
        sVar18 = SPV_SUCCESS;
        ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                  (_,uVar13,inst,(Instruction *)0x0);
      }
      break;
    }
LAB_00192f34:
    ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
    pcVar38 = "OpLoad type for pointer <id> ";
    lVar31 = 0x1d;
LAB_00193966:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
    ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
    pcVar38 = " is not a pointer type.";
    lVar31 = 0x17;
    goto LAB_00193f55;
  case 0x3e:
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar22 = ValidationState_t::FindDef(_,uVar13);
    if ((pIVar22 == (Instruction *)0x0) ||
       ((AVar11 = ValidationState_t::addressing_model(_), AVar11 == AddressingModelLogical &&
        ((((_->features_).variable_pointers == false &&
          (iVar17 = spvOpcodeReturnsLogicalPointer((uint)(pIVar22->inst_).opcode), iVar17 == 0)) ||
         (((_->features_).variable_pointers == true &&
          (bVar7 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar22->inst_).opcode), !bVar7))))
        )))) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar38 = "OpStore Pointer <id> ";
      lVar31 = 0x15;
LAB_00193f22:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " is not a logical pointer.";
      lVar31 = 0x1a;
      goto LAB_00193f55;
    }
    pIVar23 = ValidationState_t::FindDef(_,(pIVar22->inst_).type_id);
    if (pIVar23 == (Instruction *)0x0) {
LAB_0019393f:
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar38 = "OpStore type for pointer <id> ";
      lVar31 = 0x1e;
      goto LAB_00193966;
    }
    uVar4 = (pIVar23->inst_).opcode;
    if (uVar4 == 0x20) {
      uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
      local_258 = ValidationState_t::FindDef(_,uVar15);
      if ((local_258 == (Instruction *)0x0) || ((local_258->inst_).opcode == 0x13)) {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
        local_298._20_4_ = uVar13;
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                   local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"s type is void.",0xf);
        unaff_R15D = local_48;
        if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
          operator_delete(local_2a8._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        bVar7 = false;
        uVar13 = local_298._20_4_;
      }
      else {
        bVar7 = true;
      }
      sVar18 = unaff_R15D;
      if (!bVar7) break;
    }
    else {
      if (uVar4 != 0x1141) goto LAB_0019393f;
      local_258 = (Instruction *)0x0;
    }
    bVar7 = ValidationState_t::GetPointerTypeInfo
                      (_,(pIVar23->inst_).result_id,(uint32_t *)local_248,
                       (StorageClass *)(local_238 + 0x10));
    if (bVar7) {
      if (((uint)local_238._16_4_ < 10) && ((0x203U >> (local_238._16_4_ & 0x1f) & 1) != 0)) {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                   local_2a8._8_8_);
        pcVar38 = " storage class is read-only";
        lVar31 = 0x1b;
        goto LAB_00194eac;
      }
      if (local_238._16_4_ != 0x14db) {
        if (local_238._16_4_ != 0x14df) goto LAB_00195e7c;
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,
                   "ShaderRecordBufferKHR Storage Class variables are read only",0x3b);
        unaff_R15D = local_48;
        goto LAB_00194ede;
      }
      local_298._20_4_ = uVar13;
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_218,_,0x125f,(char *)0x0);
      local_220 = ValidationState_t::function(_,inst->function_->id_);
      pVVar2 = (ValidationState_t *)(local_278 + 0x10);
      local_278._0_8_ = pVVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_278,local_218._M_unused._M_object,
                 local_218._8_8_ + (long)local_218._M_unused._0_8_);
      local_298._0_8_ = (spv_const_context)0x0;
      local_298._8_8_ = (spv_const_validator_options)0x0;
      local_2a8._M_unused._M_object = (void *)0x0;
      local_2a8._8_8_ = 0;
      local_2a8._M_unused._M_object = operator_new(0x20);
      ((ValidationState_t *)local_2a8._M_unused._0_8_)->context_ =
           (spv_const_context)&((ValidationState_t *)local_2a8._M_unused._0_8_)->words_;
      if ((ValidationState_t *)local_278._0_8_ == pVVar2) {
        ((ValidationState_t *)local_2a8._M_unused._0_8_)->words_ = (uint32_t *)local_278._16_8_;
        ((ValidationState_t *)local_2a8._M_unused._0_8_)->num_words_ = local_278._24_8_;
      }
      else {
        ((ValidationState_t *)local_2a8._M_unused._0_8_)->context_ =
             (spv_const_context)local_278._0_8_;
        ((ValidationState_t *)local_2a8._M_unused._0_8_)->words_ = (uint32_t *)local_278._16_8_;
      }
      ((ValidationState_t *)local_2a8._M_unused._0_8_)->options_ =
           (spv_const_validator_options)local_278._8_8_;
      local_278._8_8_ = (spv_const_validator_options)0x0;
      local_278._16_8_ = local_278._16_8_ & 0xffffffffffffff00;
      local_298._8_8_ =
           std::
           _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1088:15)>
           ::_M_invoke;
      local_298._0_8_ =
           std::
           _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1088:15)>
           ::_M_manager;
      local_278._0_8_ = pVVar2;
      Function::RegisterExecutionModelLimitation
                (local_220,
                 (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                  *)&local_2a8);
      if ((spv_const_context)local_298._0_8_ != (spv_const_context)0x0) {
        (*(code *)local_298._0_8_)(&local_2a8,&local_2a8,3);
      }
      uVar13 = local_298._20_4_;
      if ((ValidationState_t *)local_278._0_8_ != pVVar2) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
      }
      if ((code **)local_218._M_unused._0_8_ != &local_208) {
        operator_delete(local_218._M_unused._M_object,(ulong)(local_208 + 1));
      }
LAB_00195e7c:
      bVar8 = spvIsVulkanEnv(_->context_->target_env);
      bVar7 = true;
      if (((bVar8) && (local_238._16_4_ == 2)) &&
         (pIVar22 = ValidationState_t::TracePointer(_,pIVar22), (pIVar22->inst_).opcode == 0x3b)) {
        uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,0);
        pIVar22 = ValidationState_t::FindDef(_,uVar15);
        uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
        pIVar22 = ValidationState_t::FindDef(_,uVar15);
        if (((pIVar22->inst_).opcode & 0xfffe) == 0x1c) {
          uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,1);
          pIVar22 = ValidationState_t::FindDef(_,uVar15);
        }
        bVar7 = ValidationState_t::HasDecoration(_,(pIVar22->inst_).result_id,Block);
        if (bVar7) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_278,_,0x1b0d,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,
                     "In the Vulkan environment, cannot store to Uniform Blocks",0x39);
          unaff_R15D = local_48;
          if ((ValidationState_t *)local_278._0_8_ != (ValidationState_t *)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        }
        bVar7 = !bVar7;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " is not pointer type";
      lVar31 = 0x14;
LAB_00194eac:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
      unaff_R15D = local_48;
      if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
        operator_delete(local_2a8._M_unused._M_object,
                        (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
      }
LAB_00194ede:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
      bVar7 = false;
    }
    sVar18 = unaff_R15D;
    if (!bVar7) break;
    uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar22 = ValidationState_t::FindDef(_,uVar15);
    if ((pIVar22 == (Instruction *)0x0) || (uVar14 = (pIVar22->inst_).type_id, uVar14 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpStore Object <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
      pcVar38 = " is not an object.";
      lVar31 = 0x12;
LAB_00194ff6:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
LAB_0019500d:
      psVar36 = (spv_const_context)local_278._16_8_;
      uVar40 = local_278._0_8_;
      if ((ValidationState_t *)local_278._0_8_ != (ValidationState_t *)(local_278 + 0x10))
      goto LAB_00193f76;
      goto LAB_00193f86;
    }
    pIVar23 = ValidationState_t::FindDef(_,uVar14);
    if ((pIVar23 == (Instruction *)0x0) || (uVar4 = (pIVar23->inst_).opcode, uVar4 == 0x13)) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpStore Object <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
      pcVar38 = "s type is void.";
      lVar31 = 0xf;
      goto LAB_00194ff6;
    }
    if ((local_258 != (Instruction *)0x0) &&
       ((local_258->inst_).result_id != (pIVar23->inst_).result_id)) {
      if ((_->options_->relax_struct_store == true) &&
         ((uVar4 == 0x1e && ((local_258->inst_).opcode == 0x1e)))) {
        bVar7 = anon_unknown_2::AreLayoutCompatibleStructs(_,local_258,pIVar23);
        if (bVar7) goto LAB_001959a0;
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"s layout does not match Object <id> ",0x24);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_248,_,(pIVar22->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_248._0_8_,local_248._8_8_);
        pcVar38 = "s layout.";
        lVar31 = 9;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"s type does not match Object <id> ",0x22);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_248,_,(pIVar22->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_248._0_8_,local_248._8_8_);
        pcVar38 = "s type.";
        lVar31 = 7;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
      if ((Instruction *)local_248._0_8_ != (Instruction *)local_238) {
        operator_delete((void *)local_248._0_8_,local_238._0_8_ + 1);
      }
      goto LAB_0019500d;
    }
LAB_001959a0:
    sVar18 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
    if (sVar18 != SPV_SUCCESS) break;
    bVar7 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    if ((((bVar7) &&
         (bVar7 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id),
         bVar7)) && (uVar3 = (pIVar23->inst_).opcode, 3 < uVar3 - 0x15)) && (uVar3 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar38 = "8- or 16-bit stores must be a scalar, vector or matrix type";
      lVar31 = 0x3b;
      goto LAB_00193bb9;
    }
    bVar7 = spvIsVulkanEnv(_->context_->target_env);
    if ((bVar7) && (_->options_->before_hlsl_legalization == false)) {
      local_218._M_unused._M_object = (void *)0x0;
      local_218._8_8_ = 0;
      local_200 = std::
                  _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1174:34)>
                  ::_M_invoke;
      local_208 = std::
                  _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp:1174:34)>
                  ::_M_manager;
      bVar7 = ValidationState_t::ContainsType
                        (_,(pIVar23->inst_).result_id,
                         (function<bool_(const_spvtools::val::Instruction_*)> *)&local_218,true);
      if (local_208 != (code *)0x0) {
        (*local_208)(&local_218,&local_218,3);
      }
      if (bVar7) {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)local_278,_,0x1b0c,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,
                   "Cannot store to OpTypeImage, OpTypeSampler, OpTypeSampledImage, or OpTypeAccelerationStructureKHR objects"
                   ,0x69);
        if ((ValidationState_t *)local_278._0_8_ != (ValidationState_t *)(local_278 + 0x10)) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        unaff_R15D = local_48;
      }
      sVar18 = unaff_R15D;
      if (bVar7) break;
    }
    goto LAB_0019430f;
  case 0x3f:
  case 0x40:
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar22 = ValidationState_t::FindDef(_,uVar13);
    if (pIVar22 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Target operand <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " is not defined.";
      lVar31 = 0x10;
LAB_001935f1:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
LAB_00193f6c:
      psVar36 = (spv_const_context)local_298._0_8_;
      uVar40 = local_2a8._M_unused._0_8_;
      if ((ValidationState_t *)local_2a8._M_unused._0_8_ == (ValidationState_t *)local_298)
      goto LAB_00193f86;
LAB_00193f76:
      operator_delete((void *)uVar40,(ulong)((long)&psVar36->target_env + 1));
LAB_00193f86:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
      sVar18 = local_48;
      break;
    }
    uVar14 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar23 = ValidationState_t::FindDef(_,uVar14);
    if (pIVar23 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Source operand <id> ",0x14);
      goto LAB_0019391a;
    }
    pIVar22 = ValidationState_t::FindDef(_,(pIVar22->inst_).type_id);
    if ((pIVar22 == (Instruction *)0x0) ||
       ((uVar4 = (pIVar22->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Target operand <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " is not a pointer.";
      lVar31 = 0x12;
      goto LAB_001935f1;
    }
    local_258 = pIVar22;
    pIVar22 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
    if ((pIVar22 == (Instruction *)0x0) ||
       ((uVar4 = (pIVar22->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Source operand <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " is not a pointer.";
      lVar31 = 0x12;
      goto LAB_00193f55;
    }
    if ((inst->inst_).opcode == 0x3f) {
      if ((local_258->inst_).opcode == 0x20) {
        uVar15 = Instruction::GetOperandAs<unsigned_int>(local_258,2);
        pIVar23 = ValidationState_t::FindDef(_,uVar15);
        if ((pIVar23 != (Instruction *)0x0) && ((pIVar23->inst_).opcode != 0x13)) goto LAB_00195077;
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"Target operand <id> ",0x14);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                   local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data," cannot be a void pointer.",0x1a);
        id = local_48;
LAB_00195126:
        if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
          operator_delete(local_2a8._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
        }
LAB_00195140:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        bVar7 = false;
      }
      else {
        pIVar23 = (Instruction *)0x0;
LAB_00195077:
        if (uVar4 == 0x20) {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
          pIVar22 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar22 == (Instruction *)0x0) || ((pIVar22->inst_).opcode == 0x13)) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"Source operand <id> ",0x14);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                       local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," cannot be a void pointer.",0x1a);
            id = local_48;
            goto LAB_00195126;
          }
        }
        else {
          pIVar22 = (Instruction *)0x0;
        }
        if (((pIVar23 != (Instruction *)0x0) && (pIVar22 != (Instruction *)0x0)) &&
           ((pIVar23->inst_).result_id != (pIVar22->inst_).result_id)) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"Target <id> ",0xc);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                     local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"s type does not match Source <id> ",0x22);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,(pIVar22->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"s type.",7);
          id = local_48;
          if ((ValidationState_t *)local_278._0_8_ != (ValidationState_t *)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
          }
          goto LAB_00195126;
        }
        if (pIVar23 == (Instruction *)0x0 && pIVar22 == (Instruction *)0x0) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,
                     "One of Source or Target must be a typed pointer",0x2f);
          id = local_48;
          goto LAB_00195140;
        }
        id = anon_unknown_2::CheckMemoryAccess(_,inst,2);
        bVar7 = id == SPV_SUCCESS;
      }
      sVar18 = id;
      if (!bVar7) break;
      goto LAB_00195cb3;
    }
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    __return_storage_ptr__ = (_Any_data *)ValidationState_t::FindDef(_,uVar13);
    if (__return_storage_ptr__ == (_Any_data *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " is not defined.";
      lVar31 = 0x10;
LAB_00195c72:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
      id = local_48;
      if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
        operator_delete(local_2a8._M_unused._M_object,
                        (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
      goto LAB_00195ca9;
    }
    pIVar23 = ValidationState_t::FindDef
                        (_,*(uint32_t *)(__return_storage_ptr__->_M_pod_data + 0x40));
    bVar7 = ValidationState_t::IsIntScalarType(_,(pIVar23->inst_).result_id);
    if (!bVar7) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " must be a scalar integer type.";
      lVar31 = 0x1f;
      goto LAB_00195c72;
    }
    if (*(uint16_t *)(__return_storage_ptr__->_M_pod_data + 0x3a) == 0x2b) {
      if (((pIVar23->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start[3] != 1) ||
         (-1 < (int)(*(pointer *)((long)__return_storage_ptr__ + 8))[-1])) {
        uVar29 = (long)*(pointer *)((long)__return_storage_ptr__ + 8) -
                 *(long *)__return_storage_ptr__ >> 2;
        uVar32 = 3;
        if (3 < uVar29) {
          do {
            if (*(int *)(*(long *)__return_storage_ptr__ + uVar32 * 4) != 0) goto LAB_001945b2;
            uVar32 = uVar32 + 1;
          } while (uVar29 != uVar32);
        }
        goto LAB_00195c16;
      }
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " cannot have the sign bit set to 1.";
      lVar31 = 0x23;
      goto LAB_00195c72;
    }
    if (*(uint16_t *)(__return_storage_ptr__->_M_pod_data + 0x3a) == 0x2e) {
LAB_00195c16:
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      pcVar38 = " cannot be a constant zero.";
      lVar31 = 0x1b;
      goto LAB_00195c72;
    }
LAB_001945b2:
    pCVar1 = &_->module_capabilities_;
    bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
    if (!bVar7) goto LAB_00196a40;
    __return_storage_ptr__ = &local_218;
    ValidationState_t::EvalInt32IfConst
              ((tuple<bool,_bool,_unsigned_int> *)__return_storage_ptr__,_,uVar13);
    local_298._20_4_ = local_218._0_4_;
    bVar7 = true;
    if (((local_218._M_unused._M_member_pointer & 3) != 0 & local_218._M_pod_data[4]) != 1)
    goto LAB_00196a38;
    local_40._0_4_ = Instruction::GetOperandAs<spv::StorageClass>(pIVar22,1);
    local_40._4_4_ = extraout_var_00;
    SVar12 = Instruction::GetOperandAs<spv::StorageClass>(local_258,1);
    local_38 = (_Base_ptr)CONCAT44(extraout_var_01,SVar12);
    bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt8);
    local_220 = (Function *)CONCAT71(local_220._1_7_,bVar7);
    bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityUniformAndStorageBuffer8BitAccess);
    bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer8BitAccess);
    local_24a = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant8);
    local_298[0x1b] =
         EnumSet<spv::Capability>::contains
                   (pCVar1,CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR);
    local_249 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt16);
    bVar9 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageUniform16);
    local_298[0x1a] = bVar7 || bVar9;
    local_298[0x1d] = bVar7;
    bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer16BitAccess);
    uVar29 = CONCAT71(extraout_var,bVar10) & 0xffffffff;
    bVar42 = (byte)uVar29 | bVar9 | (bVar8 || bVar7);
    __return_storage_ptr__ = (_Any_data *)CONCAT71((int7)(uVar29 >> 8),bVar42);
    local_298[0x1c] = bVar8 || bVar7;
    bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant16);
    bVar6 = local_24a;
    bVar41 = bVar7 | local_24a;
    local_298[0x1e] = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageInputOutput16);
    bVar7 = EnumSet<spv::Capability>::contains
                      (pCVar1,CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR);
    p_Var24 = (_Any_data *)(ulong)bVar7;
    bVar27 = 0;
    bVar30 = 0;
    switch((_Rb_tree_color)local_40) {
    case _S_black:
    case 3:
      bVar30 = 0;
      bVar27 = local_298[0x1e];
      break;
    case 2:
      p_Var24 = (_Any_data *)(ulong)local_298[0x1a];
      bVar30 = local_298[0x1d];
      goto LAB_001968d5;
    case 4:
      bVar30 = local_298[0x1b];
      goto LAB_001968d5;
    case 5:
    case 6:
    case 7:
    case 8:
    case 10:
    case 0xb:
      break;
    case 9:
      bVar27 = bVar41;
      bVar30 = bVar6;
      break;
    case 0xc:
      p_Var24 = __return_storage_ptr__;
      bVar30 = local_298[0x1c];
LAB_001968d5:
      bVar27 = (byte)p_Var24;
      break;
    default:
      bVar30 = 0;
    }
    bVar39 = 0;
    bVar34 = 0;
    switch((int)local_38) {
    case 2:
      bVar39 = local_298[0x1d];
      bVar34 = local_298[0x1a];
      break;
    case 3:
      bVar39 = 0;
      bVar34 = local_298[0x1e];
      break;
    case 4:
      bVar39 = local_298[0x1b];
      bVar34 = bVar7;
      break;
    case 5:
    case 6:
    case 7:
    case 8:
    case 10:
    case 0xb:
      break;
    case 9:
      bVar39 = bVar6;
      bVar34 = bVar41;
      break;
    case 0xc:
      bVar39 = local_298[0x1c];
      bVar34 = bVar42;
      break;
    default:
      bVar39 = 0;
      bVar34 = 0;
    }
    if ((local_249 == '\0' && (bVar27 & bVar34) == 0) && local_220._0_1_ == false) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar38 = "Size must be a multiple of 4";
LAB_00196a19:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar38,0x1c);
      __return_storage_ptr__ = (_Any_data *)(ulong)(uint)local_48;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
      bVar7 = false;
    }
    else {
      bVar7 = true;
      if ((local_220._0_1_ == false && (bVar30 & bVar39) == 0) && (local_298._20_4_ & 1) != 0) {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar38 = "Size must be a multiple of 2";
        goto LAB_00196a19;
      }
    }
LAB_00196a38:
    id = (spv_result_t)__return_storage_ptr__;
    if (bVar7) {
LAB_00196a40:
      sVar18 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
      bVar7 = sVar18 == SPV_SUCCESS;
      id = (spv_result_t)__return_storage_ptr__;
      if (!bVar7) {
        id = sVar18;
      }
    }
    else {
LAB_00195ca9:
      bVar7 = false;
    }
    sVar18 = id;
    if (bVar7) {
LAB_00195cb3:
      uVar3 = (inst->inst_).opcode;
      if (1 < uVar3 - 0x3f) {
        __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_memory.cpp"
                      ,0x4ab,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                     );
      }
      uVar13 = uVar3 == 0x3f ^ 3;
      if ((ulong)uVar13 <
          (ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        sVar18 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar13);
        if (sVar18 == SPV_SUCCESS) {
          uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar13);
          uVar13 = (((uVar15 >> 3 & 1) + uVar13 + (uint)((uVar15 >> 4 & 1) != 0)) -
                   (uint)((uVar15 & 2) == 0)) + 2;
          bVar7 = true;
          if ((ulong)uVar13 <
              (ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            if ((_->features_).copy_memory_permits_two_memory_accesses == true) {
              sVar19 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar13);
              if (sVar19 == SPV_SUCCESS) {
                if ((uVar15 & 0x10) == 0) {
                  uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar13);
                  bVar7 = (uVar13 & 8) == 0;
                  if (bVar7) goto LAB_00196782;
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar38 = "Source memory access must not include MakePointerAvailableKHR";
                  lVar31 = 0x3d;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar38 = "Target memory access must not include MakePointerVisibleKHR";
                  lVar31 = 0x3b;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
                sVar19 = local_48;
                goto LAB_00196778;
              }
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,inst);
              local_2a8._M_unused._0_8_ = (undefined8)spvOpcodeString((uint)(inst->inst_).opcode);
              pDVar26 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)&local_2a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar26,
                         " with two memory access operands requires SPIR-V 1.4 or later",0x3d);
              sVar19 = pDVar26->error_;
LAB_00196778:
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            }
            sVar18 = sVar19;
            bVar7 = false;
          }
LAB_00196782:
          if (bVar7) goto LAB_00196786;
        }
      }
      else {
LAB_00196786:
        sVar18 = SPV_SUCCESS;
      }
      if (sVar18 == SPV_SUCCESS) {
        pIVar22 = local_258;
        if ((local_258->inst_).opcode == 0x20) {
          do {
            uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
            pIVar22 = ValidationState_t::FindDef(_,uVar13);
          } while ((pIVar22->inst_).opcode == 0x20);
          bVar8 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          bVar7 = true;
          if ((bVar8) &&
             (bVar8 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                (_,(pIVar22->inst_).result_id), bVar8)) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,
                       "Cannot copy memory of objects containing 8- or 16-bit types",0x3b);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            bVar7 = false;
            id = local_48;
          }
joined_r0x0019664d:
          sVar18 = id;
          if (!bVar7) break;
        }
LAB_0019430f:
        sVar18 = SPV_SUCCESS;
      }
    }
    break;
  case 0x41:
  case 0x42:
  case 0x46:
switchD_001925f4_caseD_1143:
    sVar18 = anon_unknown_2::ValidateAccessChain(_,inst);
    break;
  case 0x43:
switchD_001925f4_caseD_1147:
    AVar11 = ValidationState_t::addressing_model(_);
    if (((AVar11 == AddressingModelLogical) && ((inst->inst_).opcode == 0x43)) &&
       ((_->features_).variable_pointers == false)) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,
                 "Generating variable pointers requires capability ",0x31);
      pcVar38 = "VariablePointers or VariablePointersStorageBuffer";
      lVar31 = 0x31;
LAB_00193bb9:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
      goto LAB_00193f86;
    }
    sVar18 = anon_unknown_2::ValidateAccessChain(_,inst);
    if (sVar18 != SPV_SUCCESS) break;
    bVar7 = spvOpcodeGeneratesUntypedPointer((uint)(inst->inst_).opcode);
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar22 = ValidationState_t::FindDef(_,uVar13);
    local_258 = (Instruction *)CONCAT71(local_258._1_7_,bVar7);
    if (bVar7) {
      uVar14 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    }
    else {
      uVar14 = (pIVar22->inst_).type_id;
    }
    pIVar22 = ValidationState_t::FindDef(_,uVar14);
    SVar12 = Instruction::GetOperandAs<spv::StorageClass>(pIVar22,1);
    pCVar1 = &_->module_capabilities_;
    bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
    if ((bVar7) &&
       ((((SVar12 < (StorageBuffer|Input) && ((0x1204U >> (SVar12 & 0x1f) & 1) != 0)) ||
         ((SVar12 == PhysicalStorageBuffer ||
          ((bVar7 = EnumSet<spv::Capability>::contains
                              (pCVar1,CapabilityWorkgroupMemoryExplicitLayoutKHR),
           SVar12 == StorageClassWorkgroup && (bVar7)))))) &&
        (bVar7 = ValidationState_t::HasDecoration(_,(pIVar22->inst_).result_id,ArrayStride), !bVar7)
        ))) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar38 = "OpPtrAccessChain must have a Base whose type is decorated with ArrayStride";
      lVar31 = 0x4a;
      goto LAB_00193bb9;
    }
    bVar7 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar7) goto LAB_0019430f;
    if ((char)local_258 == '\0') {
      bVar8 = false;
    }
    else {
      bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityUntypedPointersKHR);
    }
    bVar7 = true;
    id = sVar18;
    if (SVar12 != PhysicalStorageBuffer) {
      if (SVar12 == StorageBuffer) {
        if (bVar8 == false && (_->features_).variable_pointers == false) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a8,_,0x1de4,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                     local_2a8._8_8_);
          pcVar38 = 
          "OpPtrAccessChain Base operand pointing to StorageBuffer storage class must use VariablePointers or VariablePointersStorageBuffer capability"
          ;
          lVar31 = 0x8b;
          goto LAB_001942cf;
        }
      }
      else if (SVar12 == StorageClassWorkgroup) {
        bVar9 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityVariablePointers);
        bVar7 = true;
        if (bVar8 == false && !bVar9) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a8,_,0x1de3,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                     local_2a8._8_8_);
          pcVar38 = 
          "OpPtrAccessChain Base operand pointing to Workgroup storage class must use VariablePointers capability"
          ;
          lVar31 = 0x66;
LAB_001942cf:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
          if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
            operator_delete(local_2a8._M_unused._M_object,
                            (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
          bVar7 = false;
          id = local_48;
        }
      }
      else if (bVar8 == false) {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a8,_,0x1de2,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,
                   local_2a8._8_8_);
        pcVar38 = 
        "OpPtrAccessChain Base operand must point to Workgroup, StorageBuffer, or PhysicalStorageBuffer storage class"
        ;
        lVar31 = 0x6c;
        goto LAB_001942cf;
      }
    }
    goto joined_r0x0019664d;
  case 0x44:
switchD_001925f4_caseD_1149:
    pcVar38 = spvOpcodeString(opcode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_218._M_pod_data,pcVar38,(allocator<char> *)local_278);
    plVar20 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x3700a0);
    local_2a8._M_unused._M_object = local_298;
    p_Var28 = (_func_void *)(plVar20 + 2);
    if ((_func_void *)*plVar20 == p_Var28) {
      local_298._0_8_ = *(undefined8 *)p_Var28;
      local_298._8_8_ = plVar20[3];
    }
    else {
      local_298._0_8_ = *(undefined8 *)p_Var28;
      local_2a8._M_unused._M_object = (_func_void *)*plVar20;
    }
    local_2a8._8_8_ = plVar20[1];
    *plVar20 = (long)p_Var28;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    if ((code **)local_218._M_unused._0_8_ != &local_208) {
      operator_delete(local_218._M_unused._M_object,(ulong)(local_208 + 1));
    }
    pIVar22 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((((pIVar22->inst_).opcode != 0x15) ||
        (uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,1), uVar13 != 0x20)) ||
       (uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2), uVar13 != 0)) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
      pcVar38 = " must be OpTypeInt with width 32 and signedness 0.";
      lVar31 = 0x32;
      goto LAB_0019340c;
    }
    uVar4 = (inst->inst_).opcode;
    uVar14 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)(uVar4 == 0x1149) | 2);
    pIVar22 = ValidationState_t::FindDef(_,uVar14);
    uVar5 = (pIVar22->inst_).opcode;
    if (uVar4 != 0x1149) {
      if (uVar5 == 0x20) goto LAB_00194321;
LAB_00194425:
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"The Structure\'s type in ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
      pcVar38 = " must be a pointer to an OpTypeStruct.";
      lVar31 = 0x26;
      goto LAB_0019340c;
    }
    pIVar22 = inst;
    if (uVar5 != 0x1141) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Pointer must be an untyped pointer",0x22);
      sVar18 = local_48;
      goto LAB_00194065;
    }
LAB_00194321:
    uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
    pIVar22 = ValidationState_t::FindDef(_,uVar13);
    if ((pIVar22->inst_).opcode != 0x1e) goto LAB_00194425;
    lVar31 = (long)(pIVar22->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pIVar22->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,lVar31 - 1);
    pIVar22 = ValidationState_t::FindDef(_,uVar13);
    if ((pIVar22->inst_).opcode != 0x1d) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"The Structure\'s last member in ",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
      pcVar38 = " must be an OpTypeRuntimeArray.";
      lVar31 = 0x1f;
LAB_0019340c:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar38,lVar31);
      sVar18 = local_48;
      goto LAB_00194046;
    }
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)(uVar4 == 0x1149) + 3);
    sVar18 = SPV_SUCCESS;
    if (lVar31 - 2U != (ulong)uVar13) {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"The array member in ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_278,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_278._0_8_,local_278._8_8_);
      pcVar38 = " must be the last member of the struct.";
      lVar31 = 0x27;
      goto LAB_0019340c;
    }
LAB_0019406a:
    if ((undefined1 *)local_2a8._M_unused._0_8_ != local_298) goto LAB_00194077;
    break;
  default:
    if (uVar3 - 0x191 < 3) {
      AVar11 = ValidationState_t::addressing_model(_);
      if ((AVar11 == AddressingModelLogical) && ((_->features_).variable_pointers == false)) {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar38 = 
        "Instruction cannot for logical addressing model be used without a variable pointers capability"
        ;
        lVar31 = 0x5e;
      }
      else {
        pIVar22 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
        if ((inst->inst_).opcode == 0x193) {
          if ((pIVar22 == (Instruction *)0x0) || ((pIVar22->inst_).opcode != 0x15)) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar38 = "Result Type must be an integer scalar";
            lVar31 = 0x25;
          }
          else {
LAB_00192d7b:
            uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
            pIVar22 = ValidationState_t::FindDef(_,uVar13);
            uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,3);
            pIVar23 = ValidationState_t::FindDef(_,uVar13);
            if ((pIVar23 == (Instruction *)0x0 || pIVar22 == (Instruction *)0x0) ||
               (uVar14 = (pIVar22->inst_).type_id, uVar14 != (pIVar23->inst_).type_id)) {
              ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
              pcVar38 = "The types of Operand 1 and Operand 2 must match";
              lVar31 = 0x2f;
            }
            else {
              pIVar22 = ValidationState_t::FindDef(_,uVar14);
              if ((pIVar22 == (Instruction *)0x0) ||
                 ((uVar4 = (pIVar22->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
                ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
                pcVar38 = "Operand type must be a pointer";
                goto LAB_00193158;
              }
              SVar12 = Instruction::GetOperandAs<spv::StorageClass>(pIVar22,1);
              AVar11 = ValidationState_t::addressing_model(_);
              if (AVar11 == AddressingModelLogical) {
                if ((SVar12 & ~Generic) == StorageClassWorkgroup) {
                  sVar18 = SPV_SUCCESS;
                  if ((SVar12 != StorageClassWorkgroup) ||
                     (bVar7 = EnumSet<spv::Capability>::contains
                                        (&_->module_capabilities_,CapabilityVariablePointers), bVar7
                     )) break;
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
                  pcVar38 = 
                  "Workgroup storage class pointer requires VariablePointers capability to be specified"
                  ;
                  lVar31 = 0x54;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
                  pcVar38 = "Invalid pointer storage class";
                  lVar31 = 0x1d;
                }
              }
              else {
                sVar18 = SPV_SUCCESS;
                if (SVar12 != PhysicalStorageBuffer) break;
                ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
                pcVar38 = "Cannot use a pointer in the PhysicalStorageBuffer storage class";
                lVar31 = 0x3f;
              }
            }
          }
        }
        else {
          if ((pIVar22 != (Instruction *)0x0) && ((pIVar22->inst_).opcode == 0x14))
          goto LAB_00192d7b;
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar38 = "Result Type must be OpTypeBool";
LAB_00193158:
          lVar31 = 0x1e;
        }
      }
      goto LAB_00193bb9;
    }
    goto switchD_001925f4_caseD_1145;
  }
joined_r0x00193f8e:
  if (sVar18 == SPV_SUCCESS) {
switchD_001925f4_caseD_1145:
    sVar18 = SPV_SUCCESS;
  }
  return sVar18;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
    case spv::Op::OpCooperativeMatrixStoreTensorNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreTensorNV(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}